

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryRemove(InMemoryDirectory *this,PathPtr path)

{
  size_t *psVar1;
  size_t sVar2;
  undefined1 uVar3;
  int iVar4;
  iterator iVar5;
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
  *this_00;
  undefined4 extraout_var;
  size_t sVar6;
  char *pcVar7;
  String *pSVar8;
  key_type *__x;
  _Link_type __p;
  StringPtr name;
  Fault f;
  undefined1 local_30;
  undefined7 uStack_2f;
  Disposer local_28;
  
  sVar6 = path.parts.size_;
  pSVar8 = path.parts.ptr;
  if (sVar6 == 1) {
    local_30 = 0;
    kj::_::Mutex::lock(&(this->impl).mutex,0);
    if ((pSVar8->content).size_ == 0) {
      __x = (key_type *)0x4b4903;
    }
    else {
      __x = (key_type *)(pSVar8->content).ptr;
    }
    iVar5 = std::
            map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
            ::find(&(this->impl).value.entries,__x);
    __p = (_Link_type)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
    uVar3 = (_Link_type)iVar5._M_node != __p;
    if ((bool)uVar3) {
      this_00 = (_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                 *)std::_Rb_tree_rebalance_for_erase(iVar5._M_node,(_Rb_tree_node_base *)__p);
      std::
      _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
      ::_M_drop_node(this_00,__p);
      psVar1 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 - 1;
      iVar4 = (**((this->impl).value.clock)->_vptr_Clock)();
      (this->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar4);
    }
    kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  else if (sVar6 == 0) {
    uVar3 = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)&stack0xffffffffffffffd0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x587,FAILED,(char *)0x0,"\"can\'t remove self from self\"",
               (char (*) [28])"can\'t remove self from self");
    kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffffd0);
  }
  else {
    sVar2 = (pSVar8->content).size_;
    if (sVar2 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name.content.size_ = (size_t)pcVar7;
    name.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffd0,name,(int)sVar2 + (uint)(sVar2 == 0))
    ;
    if (local_28._vptr_Disposer == (_func_int **)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*local_28._vptr_Disposer + 0xb0))
                        (local_28._vptr_Disposer,pSVar8 + 1,sVar6 - 1);
      (*(code *)**(undefined8 **)CONCAT71(uStack_2f,local_30))
                ((undefined8 *)CONCAT71(uStack_2f,local_30),
                 (long)local_28._vptr_Disposer + *(long *)(*local_28._vptr_Disposer + -0x10));
    }
  }
  return (bool)uVar3;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't remove self from self") { return false; }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      auto iter = lock->entries.find(path[0]);
      if (iter == lock->entries.end()) {
        return false;
      } else {
        lock->entries.erase(iter);
        lock->modified();
        return true;
      }
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], WriteMode::MODIFY)) {
        return child->tryRemove(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }